

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_checkpoint_state.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnCheckpointState::FlushSegmentInternal
          (ColumnCheckpointState *this,
          unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
          *segment,idx_t segment_size)

{
  __int_type _Var1;
  PartialBlockManager *this_00;
  ColumnData *pCVar2;
  CompressionFunction *pCVar3;
  compression_serialize_state_t p_Var4;
  undefined8 uVar5;
  unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
  uVar6;
  bool bVar7;
  uint segment_size_00;
  BlockManager *this_01;
  idx_t new_size;
  pointer pCVar8;
  pointer this_02;
  BufferManager *pBVar9;
  PartialBlockForCheckpoint *this_03;
  data_ptr_t pdVar10;
  data_ptr_t __src;
  type pCVar11;
  reference pvVar12;
  uint32_t uVar13;
  BufferHandle old_handle;
  idx_t local_180;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_178;
  unique_lock<std::mutex> partial_block_lock;
  DataPointer data_pointer;
  BufferHandle new_handle;
  PartialBlockAllocation local_b8;
  BaseStatistics local_88;
  
  this_01 = PartialBlockManager::GetBlockManager(this->partial_block_manager);
  new_size = BlockManager::GetBlockSize(this_01);
  pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(segment);
  _Var1 = (pCVar8->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  if (_Var1 != 0) {
    this_02 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->(&this->global_stats);
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(segment);
    BaseStatistics::Merge(this_02,&(pCVar8->stats).statistics);
    pBVar9 = BufferManager::GetBufferManager(this->column_data->info->db->db);
    partial_block_lock._M_device = (mutex_type *)0x0;
    partial_block_lock._M_owns = false;
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(segment);
    bVar7 = BaseStatistics::IsConstant(&(pCVar8->stats).statistics);
    if (bVar7) {
      pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(segment);
      local_180 = 0xffffffffffffffff;
      ColumnSegment::ConvertToPersistent(pCVar8,(optional_ptr<duckdb::BlockManager,_true>)0x0,-1);
      uVar13 = 0;
    }
    else {
      ::std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)&data_pointer,
                 &this->partial_block_manager->partial_block_lock);
      ::std::unique_lock<std::mutex>::operator=
                (&partial_block_lock,(unique_lock<std::mutex> *)&data_pointer);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&data_pointer);
      this_00 = this->partial_block_manager;
      segment_size_00 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(segment_size);
      PartialBlockManager::GetBlockAllocation
                ((PartialBlockAllocation *)&data_pointer,this_00,segment_size_00);
      local_180 = data_pointer.block_pointer.block_id;
      if (data_pointer.statistics.type._0_8_ == 0) {
        pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                 ::operator->(segment);
        if (pCVar8->segment_size != new_size) {
          pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                   ::operator->(segment);
          ColumnSegment::Resize(pCVar8,new_size);
        }
        pCVar2 = this->column_data;
        pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  ::operator*(segment);
        make_uniq<duckdb::PartialBlockForCheckpoint,duckdb::ColumnData&,duckdb::ColumnSegment&,duckdb::PartialBlockState&,duckdb::BlockManager&>
                  ((duckdb *)&old_handle,pCVar2,pCVar11,
                   (PartialBlockState *)&data_pointer.block_pointer,
                   (BlockManager *)data_pointer.row_start);
        uVar5 = data_pointer.statistics.type._0_8_;
        data_pointer.statistics.type._0_8_ =
             old_handle.handle.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        old_handle.handle.internal.
        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        if (uVar5 != 0) {
          (**(code **)(*(long *)uVar5 + 8))();
          if (old_handle.handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            (*(code *)((((old_handle.handle.internal.
                          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.
                        internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.
                      internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
        }
      }
      else {
        this_03 = (PartialBlockForCheckpoint *)
                  unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                  ::operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                                *)&data_pointer.statistics);
        pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                 ::operator->(segment);
        (*pBVar9->_vptr_BufferManager[7])(&old_handle,pBVar9,&pCVar8->block);
        (*pBVar9->_vptr_BufferManager[7])
                  (&new_handle,pBVar9,&(this_03->super_PartialBlock).block_handle);
        pdVar10 = BufferHandle::Ptr(&new_handle);
        __src = BufferHandle::Ptr(&old_handle);
        switchD_0193dc74::default
                  (pdVar10 + data_pointer.block_pointer.unused_padding,__src,segment_size);
        pCVar2 = this->column_data;
        pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  ::operator*(segment);
        PartialBlockForCheckpoint::AddSegmentToTail
                  (this_03,pCVar2,pCVar11,data_pointer.block_pointer.unused_padding);
        BufferHandle::~BufferHandle(&new_handle);
        BufferHandle::~BufferHandle(&old_handle);
      }
      local_b8.state.block_id = data_pointer.block_pointer.block_id;
      local_b8.block_manager = (BlockManager *)data_pointer.row_start;
      local_b8._8_8_ = data_pointer.tuple_count;
      local_b8.partial_block.
      super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
           (unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
           data_pointer.statistics.type._0_8_;
      data_pointer.statistics.type.id_ = INVALID;
      data_pointer.statistics.type.physical_type_ = ~INVALID;
      data_pointer.statistics.type._2_6_ = 0;
      PartialBlockManager::RegisterPartialBlock(this->partial_block_manager,&local_b8);
      if (local_b8.partial_block.
          super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
          super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
          .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_b8.partial_block.
                              super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
                              .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl + 8
                    ))();
      }
      local_b8.partial_block.
      super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
           (__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
            )0x0;
      uVar13 = data_pointer.block_pointer.unused_padding;
      if (data_pointer.statistics.type._0_8_ != 0) {
        (**(code **)(*(long *)data_pointer.statistics.type._0_8_ + 8))();
      }
    }
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(segment);
    BaseStatistics::Copy(&local_88,&(pCVar8->stats).statistics);
    DataPointer::DataPointer(&data_pointer,&local_88);
    BaseStatistics::~BaseStatistics(&local_88);
    data_pointer.block_pointer.block_id = local_180;
    data_pointer.row_start = (this->row_group->super_SegmentBase<duckdb::RowGroup>).start;
    data_pointer.block_pointer.offset = uVar13;
    if ((this->data_pointers).
        super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
        super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->data_pointers).
        super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
        super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar12 = vector<duckdb::DataPointer,_true>::back(&this->data_pointers);
      data_pointer.row_start = pvVar12->tuple_count + pvVar12->row_start;
    }
    data_pointer.tuple_count = _Var1;
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(segment);
    pCVar3 = (pCVar8->function)._M_data;
    data_pointer.compression_type = pCVar3->type;
    p_Var4 = pCVar3->serialize_state;
    if (p_Var4 != (compression_serialize_state_t)0x0) {
      unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator*
                (segment);
      (*p_Var4)((ColumnSegment *)&old_handle);
      uVar6 = data_pointer.segment_state;
      data_pointer.segment_state.
      super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
      .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
           )(unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
             )old_handle.handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      old_handle.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      if (uVar6.
          super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
          .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)uVar6.
                              super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
                              .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>.
                              _M_head_impl + 8))();
        if (old_handle.handle.internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          (*(code *)((((old_handle.handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
                      super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
                    super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
      }
    }
    local_178._M_head_impl =
         (segment->
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    (segment->super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>).
    _M_t.super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
    super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
    SegmentTree<duckdb::ColumnSegment,_false>::AppendSegment
              (&(this->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>,
               (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)&local_178);
    ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
                &local_178);
    ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::
    emplace_back<duckdb::DataPointer>
              (&(this->data_pointers).
                super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>,
               &data_pointer);
    DataPointer::~DataPointer(&data_pointer);
    ::std::unique_lock<std::mutex>::~unique_lock(&partial_block_lock);
  }
  return;
}

Assistant:

void ColumnCheckpointState::FlushSegmentInternal(unique_ptr<ColumnSegment> segment, idx_t segment_size) {
	auto block_size = partial_block_manager.GetBlockManager().GetBlockSize();
	D_ASSERT(segment_size <= block_size);

	auto tuple_count = segment->count.load();
	if (tuple_count == 0) { // LCOV_EXCL_START
		return;
	} // LCOV_EXCL_STOP

	// merge the segment stats into the global stats
	global_stats->Merge(segment->stats.statistics);

	// get the buffer of the segment and pin it
	auto &db = column_data.GetDatabase();
	auto &buffer_manager = BufferManager::GetBufferManager(db);
	block_id_t block_id = INVALID_BLOCK;
	uint32_t offset_in_block = 0;

	unique_lock<mutex> partial_block_lock;
	if (!segment->stats.statistics.IsConstant()) {
		partial_block_lock = partial_block_manager.GetLock();

		// non-constant block
		PartialBlockAllocation allocation =
		    partial_block_manager.GetBlockAllocation(NumericCast<uint32_t>(segment_size));
		block_id = allocation.state.block_id;
		offset_in_block = allocation.state.offset;

		if (allocation.partial_block) {
			// Use an existing block.
			D_ASSERT(offset_in_block > 0);
			auto &pstate = allocation.partial_block->Cast<PartialBlockForCheckpoint>();
			// pin the source block
			auto old_handle = buffer_manager.Pin(segment->block);
			// pin the target block
			auto new_handle = buffer_manager.Pin(pstate.block_handle);
			// memcpy the contents of the old block to the new block
			memcpy(new_handle.Ptr() + offset_in_block, old_handle.Ptr(), segment_size);
			pstate.AddSegmentToTail(column_data, *segment, offset_in_block);
		} else {
			// Create a new block for future reuse.
			if (segment->SegmentSize() != block_size) {
				// the segment is smaller than the block size
				// allocate a new block and copy the data over
				D_ASSERT(segment->SegmentSize() < block_size);
				segment->Resize(block_size);
			}
			D_ASSERT(offset_in_block == 0);
			allocation.partial_block = make_uniq<PartialBlockForCheckpoint>(column_data, *segment, allocation.state,
			                                                                *allocation.block_manager);
		}
		// Writer will decide whether to reuse this block.
		partial_block_manager.RegisterPartialBlock(std::move(allocation));
	} else {
		segment->ConvertToPersistent(nullptr, INVALID_BLOCK);
	}

	// construct the data pointer
	DataPointer data_pointer(segment->stats.statistics.Copy());
	data_pointer.block_pointer.block_id = block_id;
	data_pointer.block_pointer.offset = offset_in_block;
	data_pointer.row_start = row_group.start;
	if (!data_pointers.empty()) {
		auto &last_pointer = data_pointers.back();
		data_pointer.row_start = last_pointer.row_start + last_pointer.tuple_count;
	}
	data_pointer.tuple_count = tuple_count;
	auto &compression_function = segment->GetCompressionFunction();
	data_pointer.compression_type = compression_function.type;
	if (compression_function.serialize_state) {
		data_pointer.segment_state = compression_function.serialize_state(*segment);
	}

	// append the segment to the new segment tree
	new_tree.AppendSegment(std::move(segment));
	data_pointers.push_back(std::move(data_pointer));
}